

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBlifMv.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkStrashBlifMv(Abc_Ntk_t *pNtk)

{
  int iVar1;
  long *plVar2;
  Abc_Ntk_t *pAVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  int *piVar7;
  Vec_Ptr_t *pVVar8;
  Abc_Ntk_t *pNtk_00;
  char *pcVar9;
  void *pvVar10;
  uint *puVar11;
  Abc_Obj_t *pAVar12;
  Abc_Obj_t *pAVar13;
  char *pcVar14;
  Vec_Ptr_t *pVVar15;
  void **ppvVar16;
  Abc_Obj_t *pAVar17;
  uint uVar18;
  long lVar19;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int iVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  bool bVar27;
  char Suffix [16];
  ulong local_88;
  int local_70;
  char local_48 [24];
  
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                  ,0x18a,"Abc_Ntk_t *Abc_NtkStrashBlifMv(Abc_Ntk_t *)");
  }
  if (pNtk->ntkFunc != ABC_FUNC_BLIFMV) {
    __assert_fail("Abc_NtkHasBlifMv(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                  ,0x18b,"Abc_Ntk_t *Abc_NtkStrashBlifMv(Abc_Ntk_t *)");
  }
  if (pNtk->nObjCounts[9] != 0) {
    __assert_fail("Abc_NtkWhiteboxNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                  ,0x18c,"Abc_Ntk_t *Abc_NtkStrashBlifMv(Abc_Ntk_t *)");
  }
  if (pNtk->nObjCounts[10] != 0) {
    __assert_fail("Abc_NtkBlackboxNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                  ,0x18d,"Abc_Ntk_t *Abc_NtkStrashBlifMv(Abc_Ntk_t *)");
  }
  pVVar8 = pNtk->vObjs;
  if (pVVar8->nSize < 1) {
    iVar5 = 2;
  }
  else {
    iVar5 = 2;
    lVar24 = 0;
    do {
      pAVar17 = (Abc_Obj_t *)pVVar8->pArray[lVar24];
      if ((pAVar17 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar17->field_0x14 & 0xf) == 6)) {
        pVVar8 = pAVar17->pNtk->vAttrs;
        if (pVVar8->nSize < 0xd) goto LAB_00840172;
        iVar4 = 2;
        if ((pVVar8->pArray[0xc] != (void *)0x0) &&
           (pvVar6 = Abc_ObjMvVar(pAVar17), pvVar6 != (void *)0x0)) {
          piVar7 = (int *)Abc_ObjMvVar(pAVar17);
          iVar4 = *piVar7;
        }
        if (iVar5 <= iVar4) {
          iVar5 = iVar4;
        }
        pVVar8 = pNtk->vObjs;
      }
      lVar24 = lVar24 + 1;
    } while (lVar24 < pVVar8->nSize);
  }
  uVar18 = 0x1f;
  if (iVar5 - 1U != 0) {
    for (; iVar5 - 1U >> uVar18 == 0; uVar18 = uVar18 - 1) {
    }
  }
  pvVar6 = malloc((ulong)((uVar18 ^ 0x1f) * -8 + 0x100));
  Abc_NtkCleanCopy(pNtk);
  pVVar8 = Abc_NtkDfs(pNtk,0);
  pNtk_00 = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  pcVar9 = Extra_UtilStrsav(pNtk->pName);
  pNtk_00->pName = pcVar9;
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar4 = pNtk->vObjs->nSize;
    uVar25 = (long)iVar4 + 500;
    iVar20 = (int)uVar25;
    if ((pNtk->vTravIds).nCap < iVar20) {
      piVar7 = (int *)malloc(uVar25 * 4);
      (pNtk->vTravIds).pArray = piVar7;
      if (piVar7 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar20;
    }
    else {
      piVar7 = (int *)0x0;
    }
    if (-500 < iVar4) {
      memset(piVar7,0,(uVar25 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar20;
  }
  iVar4 = pNtk->nTravIds;
  pNtk->nTravIds = iVar4 + 1;
  if (0x3ffffffe < iVar4) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  pVVar15 = pNtk->vCis;
  if (0 < pVVar15->nSize) {
    lVar24 = 0;
    do {
      plVar2 = (long *)pVVar15->pArray[lVar24];
      if ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 2) {
        pAVar17 = *(Abc_Obj_t **)
                   (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[6] * 8);
        pVVar15 = pAVar17->pNtk->vAttrs;
        if (pVVar15->nSize < 0xd) goto LAB_00840172;
        uVar25 = 2;
        if ((pVVar15->pArray[0xc] != (void *)0x0) &&
           (pvVar10 = Abc_ObjMvVar(pAVar17), pvVar10 != (void *)0x0)) {
          puVar11 = (uint *)Abc_ObjMvVar(pAVar17);
          uVar25 = (ulong)*puVar11;
        }
        uVar18 = (uint)uVar25;
        pvVar10 = malloc((long)(int)uVar18 << 3);
        if (uVar18 < 2) {
          uVar22 = 1;
          iVar4 = extraout_EDX;
          if (uVar18 != 0) goto LAB_0083f3a1;
        }
        else {
          uVar22 = 0x1f;
          if (uVar18 - 1 != 0) {
            for (; uVar18 - 1 >> uVar22 == 0; uVar22 = uVar22 - 1) {
            }
          }
          uVar22 = (uVar22 ^ 0xffffffe0) + 0x21;
LAB_0083f3a1:
          uVar23 = 0;
          do {
            pAVar12 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PI);
            *(Abc_Obj_t **)((long)pvVar6 + uVar23 * 8) = pAVar12;
            if (iVar5 == 2) {
              pcVar14 = Abc_ObjName(pAVar17);
              pcVar9 = (char *)0x0;
            }
            else {
              if (3 < (*(uint *)&pAVar12->field_0x14 & 0xe) - 2) goto LAB_00840153;
              if ((*(uint *)&pAVar17->field_0x14 & 0xf) != 6) goto LAB_00840134;
              pcVar9 = local_48;
              sprintf(pcVar9,"[%d]",uVar23 & 0xffffffff);
              pcVar14 = Abc_ObjName(pAVar17);
            }
            Abc_ObjAssignName(pAVar12,pcVar14,pcVar9);
            uVar23 = uVar23 + 1;
          } while (uVar22 != uVar23);
          iVar4 = extraout_EDX_00;
          if (0 < (int)uVar18) {
            uVar23 = 0;
            do {
              pAVar12 = Abc_AigConst1(pNtk_00);
              *(Abc_Obj_t **)((long)pvVar10 + uVar23 * 8) = pAVar12;
              uVar26 = 0;
              do {
                pAVar12 = Abc_AigAnd((Abc_Aig_t *)pNtk_00->pManFunc,pAVar12,
                                     (Abc_Obj_t *)
                                     ((ulong)(((uint)uVar23 >> ((uint)uVar26 & 0x1f) & 1) == 0) ^
                                     *(ulong *)((long)pvVar6 + uVar26 * 8)));
                *(Abc_Obj_t **)((long)pvVar10 + uVar23 * 8) = pAVar12;
                uVar26 = uVar26 + 1;
              } while (uVar22 != uVar26);
              uVar23 = uVar23 + 1;
              iVar4 = extraout_EDX_01;
            } while (uVar23 != uVar25);
          }
        }
        (pAVar17->field_6).pTemp = pvVar10;
        pAVar3 = pAVar17->pNtk;
        iVar20 = pAVar17->Id;
        iVar1 = pAVar3->nTravIds;
        Vec_IntFillExtra(&pAVar3->vTravIds,iVar20 + 1,iVar4);
        if (((long)iVar20 < 0) || ((pAVar3->vTravIds).nSize <= iVar20)) goto LAB_00840191;
        (pAVar3->vTravIds).pArray[iVar20] = iVar1;
        pVVar15 = pNtk->vCis;
      }
      lVar24 = lVar24 + 1;
    } while (lVar24 < pVVar15->nSize);
    if (0 < pVVar15->nSize) {
      lVar24 = 0;
      local_70 = 0;
      do {
        plVar2 = (long *)pVVar15->pArray[lVar24];
        if ((*(uint *)((long)plVar2 + 0x14) & 0xf) != 2) {
          pAVar17 = *(Abc_Obj_t **)
                     (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[6] * 8);
          pVVar15 = pAVar17->pNtk->vAttrs;
          if (pVVar15->nSize < 0xd) goto LAB_00840172;
          uVar25 = 2;
          if (pVVar15->pArray[0xc] != (void *)0x0) {
            pvVar10 = Abc_ObjMvVar(pAVar17);
            uVar25 = 2;
            if (pvVar10 != (void *)0x0) {
              puVar11 = (uint *)Abc_ObjMvVar(pAVar17);
              uVar25 = (ulong)*puVar11;
            }
          }
          uVar18 = (uint)uVar25;
          pvVar10 = malloc((long)(int)uVar18 << 3);
          if (uVar18 < 2) {
            uVar22 = 1;
            iVar4 = extraout_EDX_02;
            if (uVar18 != 0) goto LAB_0083f5d9;
          }
          else {
            uVar22 = 0x1f;
            if (uVar18 - 1 != 0) {
              for (; uVar18 - 1 >> uVar22 == 0; uVar22 = uVar22 - 1) {
              }
            }
            uVar22 = (uVar22 ^ 0xffffffe0) + 0x21;
LAB_0083f5d9:
            local_70 = local_70 + uVar22;
            uVar23 = 0;
            do {
              pAVar12 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_BO);
              *(Abc_Obj_t **)((long)pvVar6 + uVar23 * 8) = pAVar12;
              if (iVar5 == 2) {
                pcVar9 = Abc_ObjName(pAVar17);
                Abc_ObjAssignName(pAVar12,pcVar9,(char *)0x0);
                iVar4 = extraout_EDX_03;
              }
              else {
                if (3 < (*(uint *)&pAVar12->field_0x14 & 0xe) - 2) goto LAB_00840153;
                if ((*(uint *)&pAVar17->field_0x14 & 0xf) != 6) goto LAB_00840134;
                sprintf(local_48,"[%d]",uVar23 & 0xffffffff);
                pcVar9 = Abc_ObjName(pAVar17);
                Abc_ObjAssignName(pAVar12,pcVar9,local_48);
                iVar4 = extraout_EDX_04;
              }
              uVar23 = uVar23 + 1;
            } while (uVar22 != uVar23);
            if (0 < (int)uVar18) {
              uVar23 = 0;
              do {
                pAVar12 = Abc_AigConst1(pNtk_00);
                *(Abc_Obj_t **)((long)pvVar10 + uVar23 * 8) = pAVar12;
                uVar26 = 0;
                do {
                  pAVar12 = Abc_AigAnd((Abc_Aig_t *)pNtk_00->pManFunc,pAVar12,
                                       (Abc_Obj_t *)
                                       ((ulong)(((uint)uVar23 >> ((uint)uVar26 & 0x1f) & 1) == 0) ^
                                       *(ulong *)((long)pvVar6 + uVar26 * 8)));
                  *(Abc_Obj_t **)((long)pvVar10 + uVar23 * 8) = pAVar12;
                  uVar26 = uVar26 + 1;
                } while (uVar22 != uVar26);
                uVar23 = uVar23 + 1;
                iVar4 = extraout_EDX_05;
              } while (uVar23 != uVar25);
            }
          }
          (pAVar17->field_6).pTemp = pvVar10;
          pAVar3 = pAVar17->pNtk;
          iVar20 = pAVar17->Id;
          iVar1 = pAVar3->nTravIds;
          Vec_IntFillExtra(&pAVar3->vTravIds,iVar20 + 1,iVar4);
          if (((long)iVar20 < 0) || ((pAVar3->vTravIds).nSize <= iVar20)) {
LAB_00840191:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          (pAVar3->vTravIds).pArray[iVar20] = iVar1;
          pVVar15 = pNtk->vCis;
        }
        lVar24 = lVar24 + 1;
      } while (lVar24 < pVVar15->nSize);
      goto LAB_0083f76b;
    }
  }
  local_70 = 0;
LAB_0083f76b:
  if (0 < pVVar8->nSize) {
    lVar24 = 0;
    do {
      iVar4 = Abc_NodeStrashBlifMv(pNtk_00,(Abc_Obj_t *)pVVar8->pArray[lVar24]);
      if (iVar4 == 0) goto LAB_00840118;
      lVar24 = lVar24 + 1;
    } while (lVar24 < pVVar8->nSize);
  }
  if (pVVar8->pArray != (void **)0x0) {
    free(pVVar8->pArray);
  }
  free(pVVar8);
  pVVar8 = pNtk->vCos;
  if (pVVar8->nSize < 1) {
    iVar4 = 0;
  }
  else {
    lVar24 = 0;
    do {
      plVar2 = (long *)pVVar8->pArray[lVar24];
      if ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 3) {
        pAVar17 = *(Abc_Obj_t **)
                   (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
        pVVar8 = pAVar17->pNtk->vAttrs;
        if (pVVar8->nSize < 0xd) goto LAB_00840172;
        uVar18 = 2;
        uVar22 = 1;
        if ((pVVar8->pArray[0xc] != (void *)0x0) &&
           (pvVar10 = Abc_ObjMvVar(pAVar17), pvVar10 != (void *)0x0)) {
          puVar11 = (uint *)Abc_ObjMvVar(pAVar17);
          uVar18 = *puVar11;
          bVar27 = uVar18 != 1;
          if (uVar18 < 2) {
            uVar22 = 1;
            uVar18 = 1;
            if (bVar27) goto LAB_0083f959;
          }
          else {
            uVar22 = 0x1f;
            if (uVar18 - 1 != 0) {
              for (; uVar18 - 1 >> uVar22 == 0; uVar22 = uVar22 - 1) {
              }
            }
            uVar22 = (uVar22 ^ 0xffffffe0) + 0x21;
          }
        }
        pvVar10 = (pAVar17->field_6).pTemp;
        uVar21 = 0;
        do {
          pAVar12 = Abc_AigConst1(pNtk_00);
          pAVar12 = (Abc_Obj_t *)((ulong)pAVar12 ^ 1);
          if (0 < (int)uVar18) {
            uVar25 = 0;
            do {
              if ((1 << ((byte)uVar21 & 0x1f) & (uint)uVar25) != 0) {
                pAVar12 = Abc_AigOr((Abc_Aig_t *)pNtk_00->pManFunc,pAVar12,
                                    *(Abc_Obj_t **)((long)pvVar10 + uVar25 * 8));
              }
              uVar25 = uVar25 + 1;
            } while (uVar18 != uVar25);
          }
          pAVar13 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PO);
          Abc_ObjAddFanin(pAVar13,pAVar12);
          if (iVar5 == 2) {
            pcVar14 = Abc_ObjName(pAVar17);
            pcVar9 = (char *)0x0;
          }
          else {
            if (3 < (*(uint *)&pAVar13->field_0x14 & 0xe) - 2) goto LAB_00840153;
            if ((*(uint *)&pAVar17->field_0x14 & 0xf) != 6) goto LAB_00840134;
            pcVar9 = local_48;
            sprintf(pcVar9,"[%d]",(ulong)uVar21);
            pcVar14 = Abc_ObjName(pAVar17);
          }
          Abc_ObjAssignName(pAVar13,pcVar14,pcVar9);
          uVar21 = uVar21 + 1;
        } while (uVar21 != uVar22);
      }
LAB_0083f959:
      lVar24 = lVar24 + 1;
      pVVar8 = pNtk->vCos;
    } while (lVar24 < pVVar8->nSize);
    if (pVVar8->nSize < 1) {
      iVar4 = 0;
    }
    else {
      lVar24 = 0;
      iVar4 = 0;
      do {
        plVar2 = (long *)pVVar8->pArray[lVar24];
        if ((*(uint *)((long)plVar2 + 0x14) & 0xf) != 3) {
          pAVar17 = *(Abc_Obj_t **)
                     (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
          pVVar8 = pAVar17->pNtk->vAttrs;
          if (pVVar8->nSize < 0xd) goto LAB_00840172;
          uVar18 = 2;
          uVar22 = 1;
          if ((pVVar8->pArray[0xc] != (void *)0x0) &&
             (pvVar10 = Abc_ObjMvVar(pAVar17), pvVar10 != (void *)0x0)) {
            puVar11 = (uint *)Abc_ObjMvVar(pAVar17);
            uVar18 = *puVar11;
            bVar27 = uVar18 != 1;
            if (uVar18 < 2) {
              uVar22 = 1;
              uVar18 = 1;
              if (bVar27) goto LAB_0083fb45;
            }
            else {
              uVar22 = 0x1f;
              if (uVar18 - 1 != 0) {
                for (; uVar18 - 1 >> uVar22 == 0; uVar22 = uVar22 - 1) {
                }
              }
              uVar22 = (uVar22 ^ 0xffffffe0) + 0x21;
            }
          }
          pvVar10 = (pAVar17->field_6).pTemp;
          iVar4 = iVar4 + uVar22;
          uVar21 = 0;
          do {
            pAVar12 = Abc_AigConst1(pNtk_00);
            pAVar12 = (Abc_Obj_t *)((ulong)pAVar12 ^ 1);
            if (0 < (int)uVar18) {
              uVar25 = 0;
              do {
                if ((1 << ((byte)uVar21 & 0x1f) & (uint)uVar25) != 0) {
                  pAVar12 = Abc_AigOr((Abc_Aig_t *)pNtk_00->pManFunc,pAVar12,
                                      *(Abc_Obj_t **)((long)pvVar10 + uVar25 * 8));
                }
                uVar25 = uVar25 + 1;
              } while (uVar18 != uVar25);
            }
            pAVar13 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_BI);
            Abc_ObjAddFanin(pAVar13,pAVar12);
            if (iVar5 == 2) {
              pcVar14 = Abc_ObjName(pAVar17);
              pcVar9 = (char *)0x0;
            }
            else {
              if (3 < (*(uint *)&pAVar13->field_0x14 & 0xe) - 2) {
LAB_00840153:
                __assert_fail("Abc_ObjIsTerm(pObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                              ,0x16e,"void Abc_NtkConvertAssignName(Abc_Obj_t *, Abc_Obj_t *, int)")
                ;
              }
              if ((*(uint *)&pAVar17->field_0x14 & 0xf) != 6) {
LAB_00840134:
                __assert_fail("Abc_ObjIsNet(pNet)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                              ,0x16f,"void Abc_NtkConvertAssignName(Abc_Obj_t *, Abc_Obj_t *, int)")
                ;
              }
              pcVar9 = local_48;
              sprintf(pcVar9,"[%d]",(ulong)uVar21);
              pcVar14 = Abc_ObjName(pAVar17);
            }
            Abc_ObjAssignName(pAVar13,pcVar14,pcVar9);
            uVar21 = uVar21 + 1;
          } while (uVar21 != uVar22);
        }
LAB_0083fb45:
        lVar24 = lVar24 + 1;
        pVVar8 = pNtk->vCos;
      } while (lVar24 < pVVar8->nSize);
    }
  }
  if (pNtk->nObjCounts[8] != 0) {
    pVVar8 = pNtk_00->vPis;
    iVar5 = pVVar8->nSize;
    pVVar15 = (Vec_Ptr_t *)malloc(0x10);
    iVar20 = 8;
    if (6 < iVar5 - 1U) {
      iVar20 = iVar5;
    }
    pVVar15->nSize = 0;
    pVVar15->nCap = iVar20;
    if (iVar20 == 0) {
      ppvVar16 = (void **)0x0;
    }
    else {
      ppvVar16 = (void **)malloc((long)iVar20 << 3);
    }
    pVVar15->pArray = ppvVar16;
    iVar5 = pVVar8->nSize;
    if (0 < iVar5) {
      lVar24 = 0;
      do {
        pAVar17 = (Abc_Obj_t *)pVVar8->pArray[lVar24];
        pcVar9 = Abc_ObjName(pAVar17);
        iVar5 = strncmp(pcVar9,"free_var_",9);
        if (iVar5 == 0) {
          uVar18 = pVVar15->nSize;
          if (uVar18 == pVVar15->nCap) {
            if ((int)uVar18 < 0x10) {
              if (pVVar15->pArray == (void **)0x0) {
                ppvVar16 = (void **)malloc(0x80);
              }
              else {
                ppvVar16 = (void **)realloc(pVVar15->pArray,0x80);
              }
              pVVar15->pArray = ppvVar16;
              pVVar15->nCap = 0x10;
            }
            else {
              if (pVVar15->pArray == (void **)0x0) {
                ppvVar16 = (void **)malloc((ulong)uVar18 << 4);
              }
              else {
                ppvVar16 = (void **)realloc(pVVar15->pArray,(ulong)uVar18 << 4);
              }
              pVVar15->pArray = ppvVar16;
              pVVar15->nCap = uVar18 * 2;
            }
          }
          else {
            ppvVar16 = pVVar15->pArray;
          }
          iVar5 = pVVar15->nSize;
          pVVar15->nSize = iVar5 + 1;
          ppvVar16[iVar5] = pAVar17;
        }
        lVar24 = lVar24 + 1;
        pVVar8 = pNtk_00->vPis;
        iVar5 = pVVar8->nSize;
      } while (lVar24 < iVar5);
      if (0 < iVar5) {
        lVar24 = 0;
        do {
          pAVar17 = (Abc_Obj_t *)pVVar8->pArray[lVar24];
          pcVar9 = Abc_ObjName(pAVar17);
          iVar5 = strncmp(pcVar9,"free_var_",9);
          if (iVar5 != 0) {
            uVar18 = pVVar15->nSize;
            if (uVar18 == pVVar15->nCap) {
              if ((int)uVar18 < 0x10) {
                if (pVVar15->pArray == (void **)0x0) {
                  ppvVar16 = (void **)malloc(0x80);
                }
                else {
                  ppvVar16 = (void **)realloc(pVVar15->pArray,0x80);
                }
                pVVar15->pArray = ppvVar16;
                pVVar15->nCap = 0x10;
              }
              else {
                if (pVVar15->pArray == (void **)0x0) {
                  ppvVar16 = (void **)malloc((ulong)uVar18 << 4);
                }
                else {
                  ppvVar16 = (void **)realloc(pVVar15->pArray,(ulong)uVar18 << 4);
                }
                pVVar15->pArray = ppvVar16;
                pVVar15->nCap = uVar18 * 2;
              }
            }
            else {
              ppvVar16 = pVVar15->pArray;
            }
            iVar5 = pVVar15->nSize;
            pVVar15->nSize = iVar5 + 1;
            ppvVar16[iVar5] = pAVar17;
          }
          lVar24 = lVar24 + 1;
          pVVar8 = pNtk_00->vPis;
          iVar5 = pVVar8->nSize;
        } while (lVar24 < iVar5);
      }
    }
    if (pVVar15->nSize != iVar5) {
      __assert_fail("Vec_PtrSize(vTemp) == Vec_PtrSize(pNtkNew->vPis)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                    ,0x299,"Abc_Ntk_t *Abc_NtkStrashBlifMv(Abc_Ntk_t *)");
    }
    if (pVVar8->pArray != (void **)0x0) {
      free(pVVar8->pArray);
    }
    free(pVVar8);
    pNtk_00->vPis = pVVar15;
    pVVar8 = pNtk_00->vCis;
    uVar18 = pVVar8->nSize;
    pVVar15 = (Vec_Ptr_t *)malloc(0x10);
    local_88 = 8;
    if (6 < uVar18 - 1) {
      local_88 = (ulong)uVar18;
    }
    pVVar15->nSize = 0;
    iVar5 = (int)local_88;
    pVVar15->nCap = iVar5;
    uVar22 = 0;
    if (iVar5 == 0) {
      ppvVar16 = (void **)0x0;
    }
    else {
      ppvVar16 = (void **)malloc((long)iVar5 << 3);
    }
    pVVar15->pArray = ppvVar16;
    if (0 < (int)uVar18) {
      uVar22 = 0;
      lVar24 = 0;
      do {
        pAVar17 = (Abc_Obj_t *)pVVar8->pArray[lVar24];
        pcVar9 = Abc_ObjName(pAVar17);
        iVar5 = strncmp(pcVar9,"free_var_",9);
        if (iVar5 == 0) {
          uVar18 = (uint)local_88;
          if (uVar22 == uVar18) {
            if ((int)uVar18 < 0x10) {
              if (pVVar15->pArray == (void **)0x0) {
                ppvVar16 = (void **)malloc(0x80);
              }
              else {
                ppvVar16 = (void **)realloc(pVVar15->pArray,0x80);
              }
              pVVar15->pArray = ppvVar16;
              pVVar15->nCap = 0x10;
              local_88 = 0x10;
            }
            else {
              local_88 = (ulong)(uVar18 * 2);
              if (pVVar15->pArray == (void **)0x0) {
                ppvVar16 = (void **)malloc(local_88 * 8);
              }
              else {
                ppvVar16 = (void **)realloc(pVVar15->pArray,local_88 * 8);
              }
              pVVar15->pArray = ppvVar16;
              pVVar15->nCap = uVar18 * 2;
            }
          }
          else {
            ppvVar16 = pVVar15->pArray;
          }
          lVar19 = (long)(int)uVar22;
          uVar22 = uVar22 + 1;
          pVVar15->nSize = uVar22;
          ppvVar16[lVar19] = pAVar17;
        }
        lVar24 = lVar24 + 1;
        pVVar8 = pNtk_00->vCis;
        uVar18 = pVVar8->nSize;
      } while (lVar24 < (int)uVar18);
      if (0 < (int)uVar18) {
        lVar24 = 0;
        do {
          pAVar17 = (Abc_Obj_t *)pVVar8->pArray[lVar24];
          pcVar9 = Abc_ObjName(pAVar17);
          iVar5 = strncmp(pcVar9,"free_var_",9);
          if (iVar5 != 0) {
            uVar18 = (uint)local_88;
            if (uVar22 == uVar18) {
              if ((int)uVar18 < 0x10) {
                if (pVVar15->pArray == (void **)0x0) {
                  ppvVar16 = (void **)malloc(0x80);
                }
                else {
                  ppvVar16 = (void **)realloc(pVVar15->pArray,0x80);
                }
                pVVar15->pArray = ppvVar16;
                pVVar15->nCap = 0x10;
                local_88 = 0x10;
              }
              else {
                local_88 = (ulong)(uVar18 * 2);
                if (pVVar15->pArray == (void **)0x0) {
                  ppvVar16 = (void **)malloc(local_88 * 8);
                }
                else {
                  ppvVar16 = (void **)realloc(pVVar15->pArray,local_88 * 8);
                }
                pVVar15->pArray = ppvVar16;
                pVVar15->nCap = uVar18 * 2;
              }
            }
            else {
              ppvVar16 = pVVar15->pArray;
            }
            lVar19 = (long)(int)uVar22;
            uVar22 = uVar22 + 1;
            pVVar15->nSize = uVar22;
            ppvVar16[lVar19] = pAVar17;
          }
          lVar24 = lVar24 + 1;
          pVVar8 = pNtk_00->vCis;
          uVar18 = pVVar8->nSize;
        } while (lVar24 < (int)uVar18);
      }
    }
    if (uVar22 != uVar18) {
      __assert_fail("Vec_PtrSize(vTemp) == Vec_PtrSize(pNtkNew->vCis)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                    ,0x2a4,"Abc_Ntk_t *Abc_NtkStrashBlifMv(Abc_Ntk_t *)");
    }
    if (pVVar8->pArray != (void **)0x0) {
      free(pVVar8->pArray);
    }
    free(pVVar8);
    pNtk_00->vCis = pVVar15;
    if (local_70 != iVar4) {
      __assert_fail("nCount1 == nCount2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBlifMv.c"
                    ,0x2a8,"Abc_Ntk_t *Abc_NtkStrashBlifMv(Abc_Ntk_t *)");
    }
    if (0 < local_70) {
      local_70 = -local_70;
      do {
        pAVar17 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_LATCH);
        if ((*(uint *)&pAVar17->field_0x14 & 0xf) != 8) {
          __assert_fail("Abc_ObjIsLatch(pLatch)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                        ,0x1a4,"void Abc_LatchSetInit0(Abc_Obj_t *)");
        }
        pAVar17->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x1;
        pcVar9 = Abc_ObjName(pAVar17);
        Abc_ObjAssignName(pAVar17,pcVar9,(char *)0x0);
        iVar5 = pNtk_00->vCos->nSize;
        uVar18 = local_70 + iVar5;
        if (((int)uVar18 < 0) || (iVar5 <= (int)uVar18)) {
LAB_00840172:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        iVar5 = pNtk_00->vCis->nSize;
        uVar22 = local_70 + iVar5;
        if (((int)uVar22 < 0) || (iVar5 <= (int)uVar22)) goto LAB_00840172;
        pAVar12 = (Abc_Obj_t *)pNtk_00->vCis->pArray[uVar22];
        Abc_ObjAddFanin(pAVar17,(Abc_Obj_t *)pNtk_00->vCos->pArray[uVar18]);
        Abc_ObjAddFanin(pAVar12,pAVar17);
        local_70 = local_70 + 1;
      } while (local_70 != 0);
    }
  }
  if (pvVar6 != (void *)0x0) {
    free(pvVar6);
  }
  pVVar8 = pNtk->vObjs;
  if (0 < pVVar8->nSize) {
    lVar24 = 0;
    do {
      pvVar6 = pVVar8->pArray[lVar24];
      if ((pvVar6 != (void *)0x0) && (*(void **)((long)pvVar6 + 0x40) != (void *)0x0)) {
        free(*(void **)((long)pvVar6 + 0x40));
        *(undefined8 *)((long)pvVar6 + 0x40) = 0;
        pVVar8 = pNtk->vObjs;
      }
      lVar24 = lVar24 + 1;
    } while (lVar24 < pVVar8->nSize);
  }
  Abc_AigCleanup((Abc_Aig_t *)pNtk_00->pManFunc);
  iVar5 = Abc_NtkCheck(pNtk_00);
  if (iVar5 == 0) {
    fwrite("Abc_NtkStrashBlifMv(): Network check has failed.\n",0x31,1,_stdout);
LAB_00840118:
    Abc_NtkDelete(pNtk_00);
    pNtk_00 = (Abc_Ntk_t *)0x0;
  }
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkStrashBlifMv( Abc_Ntk_t * pNtk )
{
    int fUsePositional = 0;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t ** pBits;
    Abc_Obj_t ** pValues;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pTemp, * pBit, * pNet;
    int i, k, v, nValues, nValuesMax, nBits;
    int nCount1, nCount2;

    assert( Abc_NtkIsNetlist(pNtk) );
    assert( Abc_NtkHasBlifMv(pNtk) );
    assert( Abc_NtkWhiteboxNum(pNtk) == 0 );
    assert( Abc_NtkBlackboxNum(pNtk) == 0 );

    // get the largest number of values
    nValuesMax = 2;
    Abc_NtkForEachNet( pNtk, pObj, i )
    {
        nValues = Abc_ObjMvVarNum(pObj);
        if ( nValuesMax < nValues )
            nValuesMax = nValues;
    }
    nBits = Abc_Base2Log( nValuesMax );
    pBits = ABC_ALLOC( Abc_Obj_t *, nBits );

    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );
    // collect the nodes
    vNodes = Abc_NtkDfs( pNtk, 0 );

    // start the network
    pNtkNew = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav( pNtk->pName );
//    pNtkNew->pSpec = Extra_UtilStrsav( pNtk->pName );

    nCount1 = nCount2 = 0;
    // encode the CI nets
    Abc_NtkIncrementTravId( pNtk );
    if ( fUsePositional )
    {
        Abc_NtkForEachCi( pNtk, pObj, i )
        {
            if ( !Abc_ObjIsPi(pObj) )
                continue;
            pNet = Abc_ObjFanout0(pObj);
            nValues = Abc_ObjMvVarNum(pNet);
            pValues = ABC_ALLOC( Abc_Obj_t *, nValues );
            // create PIs for the values
            for ( v = 0; v < nValues; v++ )
            {
                pValues[v] = Abc_NtkCreatePi( pNtkNew );
                if ( nValuesMax == 2 )
                    Abc_ObjAssignName( pValues[v], Abc_ObjName(pNet), NULL );
                else
                    Abc_NtkConvertAssignName( pValues[v], pNet, v );
            }
            // save the values in the fanout net
            pNet->pCopy = (Abc_Obj_t *)pValues;
            // mark the net
            Abc_NodeSetTravIdCurrent( pNet );
        }
        Abc_NtkForEachCi( pNtk, pObj, i )
        {
            if ( Abc_ObjIsPi(pObj) )
                continue;
            pNet = Abc_ObjFanout0(pObj);
            nValues = Abc_ObjMvVarNum(pNet);
            pValues = ABC_ALLOC( Abc_Obj_t *, nValues );
            // create PIs for the values
            for ( v = 0; v < nValues; v++ )
            {
                pValues[v] = Abc_NtkCreateBo( pNtkNew );
                if ( nValuesMax == 2 )
                    Abc_ObjAssignName( pValues[v], Abc_ObjName(pNet), NULL );
                else
                    Abc_NtkConvertAssignName( pValues[v], pNet, v );
                nCount1++;
            }
            // save the values in the fanout net
            pNet->pCopy = (Abc_Obj_t *)pValues;
            // mark the net
            Abc_NodeSetTravIdCurrent( pNet );
        }
    }
    else
    {
        Abc_NtkForEachCi( pNtk, pObj, i )
        {
            if ( !Abc_ObjIsPi(pObj) )
                continue;
            pNet = Abc_ObjFanout0(pObj);
            nValues = Abc_ObjMvVarNum(pNet);
            pValues = ABC_ALLOC( Abc_Obj_t *, nValues );
            // create PIs for the encoding bits
            nBits = Abc_Base2Log( nValues );
            for ( k = 0; k < nBits; k++ )
            {
                pBits[k] = Abc_NtkCreatePi( pNtkNew );
                if ( nValuesMax == 2 )
                    Abc_ObjAssignName( pBits[k], Abc_ObjName(pNet), NULL );
                else
                    Abc_NtkConvertAssignName( pBits[k], pNet, k );
            }
            // encode the values
            for ( v = 0; v < nValues; v++ )
            {
                pValues[v] = Abc_AigConst1(pNtkNew);
                for ( k = 0; k < nBits; k++ )
                {
                    pBit = Abc_ObjNotCond( pBits[k], (v&(1<<k)) == 0 );
                    pValues[v] = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, pValues[v], pBit );
                }
            }
            // save the values in the fanout net
            pNet->pCopy = (Abc_Obj_t *)pValues;
            // mark the net
            Abc_NodeSetTravIdCurrent( pNet );
        }
        Abc_NtkForEachCi( pNtk, pObj, i )
        {
            if ( Abc_ObjIsPi(pObj) )
                continue;
            pNet = Abc_ObjFanout0(pObj);
            nValues = Abc_ObjMvVarNum(pNet);
            pValues = ABC_ALLOC( Abc_Obj_t *, nValues );
            // create PIs for the encoding bits
            nBits = Abc_Base2Log( nValues );
            for ( k = 0; k < nBits; k++ )
            {
                pBits[k] = Abc_NtkCreateBo( pNtkNew );
                if ( nValuesMax == 2 )
                    Abc_ObjAssignName( pBits[k], Abc_ObjName(pNet), NULL );
                else
                    Abc_NtkConvertAssignName( pBits[k], pNet, k );
                nCount1++;
            }
            // encode the values
            for ( v = 0; v < nValues; v++ )
            {
                pValues[v] = Abc_AigConst1(pNtkNew);
                for ( k = 0; k < nBits; k++ )
                {
                    pBit = Abc_ObjNotCond( pBits[k], (v&(1<<k)) == 0 );
                    pValues[v] = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, pValues[v], pBit );
                }
            }
            // save the values in the fanout net
            pNet->pCopy = (Abc_Obj_t *)pValues;
            // mark the net
            Abc_NodeSetTravIdCurrent( pNet );
        }
    }

    // process nodes in the topological order
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        if ( !Abc_NodeStrashBlifMv( pNtkNew, pObj ) )
        {
            Abc_NtkDelete( pNtkNew );
            return NULL;
        }
    Vec_PtrFree( vNodes );

    // encode the CO nets
    if ( fUsePositional )
    {
        Abc_NtkForEachCo( pNtk, pObj, i )
        {
            if ( !Abc_ObjIsPo(pObj) )
                continue;
            pNet = Abc_ObjFanin0(pObj);
            // skip marked nets
//            if ( Abc_NodeIsTravIdCurrent(pNet) )
//                continue;
//            Abc_NodeSetTravIdCurrent( pNet );
            nValues = Abc_ObjMvVarNum(pNet);
            pValues = (Abc_Obj_t **)pNet->pCopy;
            for ( v = 0; v < nValues; v++ )
            {
                pTemp = Abc_NtkCreatePo( pNtkNew );
                Abc_ObjAddFanin( pTemp, pValues[v] );
                if ( nValuesMax == 2 )
                    Abc_ObjAssignName( pTemp, Abc_ObjName(pNet), NULL );
                else
                    Abc_NtkConvertAssignName( pTemp, pNet, v );
            }
        }
        Abc_NtkForEachCo( pNtk, pObj, i )
        {
            if ( Abc_ObjIsPo(pObj) )
                continue;
            pNet = Abc_ObjFanin0(pObj);
            // skip marked nets
//            if ( Abc_NodeIsTravIdCurrent(pNet) )
//                continue;
//            Abc_NodeSetTravIdCurrent( pNet );
            nValues = Abc_ObjMvVarNum(pNet);
            pValues = (Abc_Obj_t **)pNet->pCopy;
            for ( v = 0; v < nValues; v++ )
            {
                pTemp = Abc_NtkCreateBi( pNtkNew );
                Abc_ObjAddFanin( pTemp, pValues[v] );
                if ( nValuesMax == 2 )
                    Abc_ObjAssignName( pTemp, Abc_ObjName(pNet), NULL );
                else
                    Abc_NtkConvertAssignName( pTemp, pNet, v );
                nCount2++;
            }
        }
    }
    else // if ( fPositional == 0 )
    {
        Abc_NtkForEachCo( pNtk, pObj, i )
        {
            if ( !Abc_ObjIsPo(pObj) )
                continue;
            pNet = Abc_ObjFanin0(pObj);
            // skip marked nets
//            if ( Abc_NodeIsTravIdCurrent(pNet) )
//                continue;
//            Abc_NodeSetTravIdCurrent( pNet );
            nValues = Abc_ObjMvVarNum(pNet);
            pValues = (Abc_Obj_t **)pNet->pCopy;
            nBits = Abc_Base2Log( nValues );
            for ( k = 0; k < nBits; k++ )
            {
                pBit = Abc_ObjNot( Abc_AigConst1(pNtkNew) );
                for ( v = 0; v < nValues; v++ )
                    if ( v & (1<<k) )
                        pBit = Abc_AigOr( (Abc_Aig_t *)pNtkNew->pManFunc, pBit, pValues[v] );
                pTemp = Abc_NtkCreatePo( pNtkNew );
                Abc_ObjAddFanin( pTemp, pBit );
                if ( nValuesMax == 2 )
                    Abc_ObjAssignName( pTemp, Abc_ObjName(pNet), NULL );
                else
                    Abc_NtkConvertAssignName( pTemp, pNet, k );
            }
        }
        Abc_NtkForEachCo( pNtk, pObj, i )
        {
            if ( Abc_ObjIsPo(pObj) )
                continue;
            pNet = Abc_ObjFanin0(pObj);
            // skip marked nets
//            if ( Abc_NodeIsTravIdCurrent(pNet) )
//                continue;
//            Abc_NodeSetTravIdCurrent( pNet );
            nValues = Abc_ObjMvVarNum(pNet);
            pValues = (Abc_Obj_t **)pNet->pCopy;
            nBits = Abc_Base2Log( nValues );
            for ( k = 0; k < nBits; k++ )
            {
                pBit = Abc_ObjNot( Abc_AigConst1(pNtkNew) );
                for ( v = 0; v < nValues; v++ )
                    if ( v & (1<<k) )
                        pBit = Abc_AigOr( (Abc_Aig_t *)pNtkNew->pManFunc, pBit, pValues[v] );
                pTemp = Abc_NtkCreateBi( pNtkNew );
                Abc_ObjAddFanin( pTemp, pBit );
                if ( nValuesMax == 2 )
                    Abc_ObjAssignName( pTemp, Abc_ObjName(pNet), NULL );
                else
                    Abc_NtkConvertAssignName( pTemp, pNet, k );
                nCount2++;
            }
        }
    }

    if ( Abc_NtkLatchNum(pNtk) )
    {
        Vec_Ptr_t * vTemp;
        Abc_Obj_t * pLatch, * pObjLi, * pObjLo;
        int i;
        // move free vars to the front among the PIs
        vTemp = Vec_PtrAlloc( Vec_PtrSize(pNtkNew->vPis) );
        Abc_NtkForEachPi( pNtkNew, pObj, i )
            if ( strncmp( Abc_ObjName(pObj), "free_var_", 9 ) == 0 )
                Vec_PtrPush( vTemp, pObj );
        Abc_NtkForEachPi( pNtkNew, pObj, i )
            if ( strncmp( Abc_ObjName(pObj), "free_var_", 9 ) != 0 )
                Vec_PtrPush( vTemp, pObj );
        assert( Vec_PtrSize(vTemp) == Vec_PtrSize(pNtkNew->vPis) );
        Vec_PtrFree( pNtkNew->vPis );
        pNtkNew->vPis = vTemp;
        // move free vars to the front among the CIs
        vTemp = Vec_PtrAlloc( Vec_PtrSize(pNtkNew->vCis) );
        Abc_NtkForEachCi( pNtkNew, pObj, i )
            if ( strncmp( Abc_ObjName(pObj), "free_var_", 9 ) == 0 )
                Vec_PtrPush( vTemp, pObj );
        Abc_NtkForEachCi( pNtkNew, pObj, i )
            if ( strncmp( Abc_ObjName(pObj), "free_var_", 9 ) != 0 )
                Vec_PtrPush( vTemp, pObj );
        assert( Vec_PtrSize(vTemp) == Vec_PtrSize(pNtkNew->vCis) );
        Vec_PtrFree( pNtkNew->vCis );
        pNtkNew->vCis = vTemp;
        // create registers
        assert( nCount1 == nCount2 );
        for ( i = 0; i < nCount1; i++ )
        {
            // create latch
            pLatch = Abc_NtkCreateLatch( pNtkNew );
            Abc_LatchSetInit0( pLatch );
            Abc_ObjAssignName( pLatch, Abc_ObjName(pLatch), NULL );
            // connect
            pObjLi = Abc_NtkCo( pNtkNew, Abc_NtkCoNum(pNtkNew)-nCount1+i );
            pObjLo = Abc_NtkCi( pNtkNew, Abc_NtkCiNum(pNtkNew)-nCount1+i );
            Abc_ObjAddFanin( pLatch, pObjLi );
            Abc_ObjAddFanin( pObjLo, pLatch );
        }
    }

    // cleanup
    ABC_FREE( pBits );
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( pObj->pCopy )
            ABC_FREE( pObj->pCopy );

    // remove dangling nodes
    i = Abc_AigCleanup((Abc_Aig_t *)pNtkNew->pManFunc);
//    printf( "Cleanup removed %d nodes.\n", i );
//    Abc_NtkReassignIds( pNtkNew );

    // check integrity
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        fprintf( stdout, "Abc_NtkStrashBlifMv(): Network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}